

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utBlendImportMaterials.cpp
# Opt level: O2

void __thiscall
BlendImportMaterials_testImportMaterialwith2texturesAnd2TexCoordMappings_Test::
BlendImportMaterials_testImportMaterialwith2texturesAnd2TexCoordMappings_Test
          (BlendImportMaterials_testImportMaterialwith2texturesAnd2TexCoordMappings_Test *this)

{
  BlendImportMaterials::BlendImportMaterials(&this->super_BlendImportMaterials);
  (this->super_BlendImportMaterials).super_Test._vptr_Test = (_func_int **)&PTR__Test_007efc48;
  return;
}

Assistant:

TEST_F(BlendImportMaterials, testImportMaterialwith2texturesAnd2TexCoordMappings)
{
    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/BLEND/plane_2_textures_2_texcoords_279.blend", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest != NULL);

    // material has 2 diffuse textures
    ASSERT_TRUE(pTest->HasMaterials());
    EXPECT_EQ(1u, pTest->mNumMaterials);
    const aiMaterial *pMat = pTest->mMaterials[0];
    ASSERT_TRUE(nullptr != pMat);
    ASSERT_EQ(2u, pMat->GetTextureCount(aiTextureType_DIFFUSE));
    aiString aPath;
    aiTextureMapping tm = aiTextureMapping::aiTextureMapping_OTHER;
    aiReturn result = pMat->GetTexture(aiTextureType_DIFFUSE, 0, &aPath, &tm);
    ASSERT_EQ(aiReturn_SUCCESS, result);
    result = pMat->GetTexture(aiTextureType_DIFFUSE, 1, &aPath, &tm);
    ASSERT_EQ(aiReturn_SUCCESS, result);

    // mesh has 2 texturecoord sets
    ASSERT_TRUE(pTest->HasMeshes());
    EXPECT_EQ(1u, pTest->mNumMeshes);
    const aiMesh *pMesh = pTest->mMeshes[0];
    ASSERT_TRUE(nullptr != pMesh);
    ASSERT_TRUE(pMesh->HasTextureCoords(0));
    ASSERT_TRUE(pMesh->HasTextureCoords(1));
}